

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

bool duckdb::Catalog::TryAutoLoad(ClientContext *context,string *original_name)

{
  bool bVar1;
  DBConfig *pDVar2;
  string *in_RSI;
  DatabaseInstance *in_RDI;
  DBConfig *dbconfig;
  string extension_name;
  string *in_stack_000000b0;
  ClientContext *in_stack_000000b8;
  shared_ptr<duckdb::DatabaseInstance,_true> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffa8;
  string local_38 [32];
  bool local_1;
  
  ExtensionHelper::ApplyExtensionAlias(in_RSI);
  shared_ptr<duckdb::DatabaseInstance,_true>::operator->(in_stack_ffffffffffffff90);
  bVar1 = DatabaseInstance::ExtensionIsLoaded(in_RDI,in_RSI);
  if (bVar1) {
    local_1 = true;
  }
  else {
    pDVar2 = DBConfig::GetConfig((ClientContext *)0x29bfcf);
    if (((pDVar2->options).autoload_known_extensions & 1U) == 0) {
      local_1 = false;
    }
    else {
      bVar1 = ExtensionHelper::CanAutoloadExtension(in_stack_ffffffffffffffa8);
      if (bVar1) {
        local_1 = ExtensionHelper::TryAutoLoadExtension(in_stack_000000b8,in_stack_000000b0);
      }
      else {
        local_1 = false;
      }
    }
  }
  ::std::__cxx11::string::~string(local_38);
  return local_1;
}

Assistant:

bool Catalog::TryAutoLoad(ClientContext &context, const string &original_name) noexcept {
	string extension_name = ExtensionHelper::ApplyExtensionAlias(original_name);
	if (context.db->ExtensionIsLoaded(extension_name)) {
		return true;
	}
#ifndef DUCKDB_DISABLE_EXTENSION_LOAD
	auto &dbconfig = DBConfig::GetConfig(context);
	if (!dbconfig.options.autoload_known_extensions) {
		return false;
	}
	try {
		if (ExtensionHelper::CanAutoloadExtension(extension_name)) {
			return ExtensionHelper::TryAutoLoadExtension(context, extension_name);
		}
	} catch (...) {
		return false;
	}
#endif
	return false;
}